

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ImageTests::ImageTests
          (ImageTests *this,EglTestContext *eglTestCtx,string *name,string *desc)

{
  TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,eglTestCtx,(name->_M_dataplus)._M_p,(desc->_M_dataplus)._M_p
            );
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTests_003de4f8;
  LabeledActions::LabeledActions(&this->m_createActions);
  return;
}

Assistant:

ImageTests						(EglTestContext& eglTestCtx, const string& name, const string& desc)
						: TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str()) {}